

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,LabelName *name)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  long in_RDX;
  string mangled;
  key_type local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,name,(long)&(name->super_LocalName).name + in_RDX);
  std::__cxx11::string::_M_replace_aux((ulong)&local_40,local_40._M_string_length,0,'\x01');
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->local_sym_map_)._M_t,&local_40);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header
     ) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->local_sym_map_,&local_40);
    WriteData(this,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("local_sym_map_.count(mangled) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x3b9,"void wabt::(anonymous namespace)::CWriter::Write(const LabelName &)");
}

Assistant:

void CWriter::Write(const LabelName& name) {
  std::string mangled = name.name + kLabelSuffix;
  assert(local_sym_map_.count(mangled) == 1);
  Write(local_sym_map_[mangled]);
}